

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveRedundantMaterials.cpp
# Opt level: O1

void __thiscall
Assimp::RemoveRedundantMatsProcess::~RemoveRedundantMatsProcess(RemoveRedundantMatsProcess *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_BaseProcess)._vptr_BaseProcess =
       (_func_int **)&PTR__RemoveRedundantMatsProcess_0082dbc0;
  pcVar2 = (this->mConfigFixedMaterials)._M_dataplus._M_p;
  paVar1 = &(this->mConfigFixedMaterials).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  BaseProcess::~BaseProcess(&this->super_BaseProcess);
  return;
}

Assistant:

RemoveRedundantMatsProcess::~RemoveRedundantMatsProcess()
{
    // nothing to do here
}